

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O1

bool __thiscall
BlockFilterIndex::ReadFilterFromDisk
          (BlockFilterIndex *this,FlatFilePos *pos,uint256 *hash,BlockFilter *filter)

{
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  vector<unsigned_char,_std::allocator<unsigned_char>_> filter_00;
  undefined1 auVar1 [16];
  FILE *file;
  BlockFilter *__nbytes;
  bool bVar2;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  string_view logging_function;
  string_view source_file;
  Span<unsigned_char> output;
  undefined8 in_stack_fffffffffffffea8;
  pointer puVar5;
  undefined8 in_stack_fffffffffffffeb0;
  pointer in_stack_fffffffffffffeb8;
  pointer puVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_filter;
  AutoFile filein;
  uint256 result;
  uint256 block_hash;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  pointer local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  __nbytes = filter;
  file = FlatFileSeq::Open((this->m_filter_fileseq)._M_t.
                           super___uniq_ptr_impl<FlatFileSeq,_std::default_delete<FlatFileSeq>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_FlatFileSeq_*,_std::default_delete<FlatFileSeq>_>.
                           super__Head_base<0UL,_FlatFileSeq_*,_false>._M_head_impl,pos,true);
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_fffffffffffffeb0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_fffffffffffffea8;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffffeb8;
  AutoFile::AutoFile(&filein,file,data_xor);
  if (filein.m_file == (FILE *)0x0) {
    bVar2 = false;
  }
  else {
    block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    AutoFile::read(&filein,(int)&block_hash,(void *)0x20,(size_t)__nbytes);
    AutoFile::operator>>(&filein,&encoded_filter);
    result.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    result.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    local_38 = (undefined1  [16])0x0;
    local_48 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    local_88 = (undefined1  [16])0x0;
    local_28 = (pointer)0x0;
    CSHA256::CSHA256((CSHA256 *)local_88);
    CSHA256::Write((CSHA256 *)local_88,
                   encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)encoded_filter.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)encoded_filter.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start);
    output.m_size = 0x20;
    output.m_data = (uchar *)&result;
    CHash256::Finalize((CHash256 *)local_88,output);
    puVar6 = encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    auVar1 = (undefined1  [16])
             encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._0_16_;
    auVar4[0] = -((hash->super_base_blob<256U>).m_data._M_elems[0x10] ==
                 result.super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar4[1] = -((hash->super_base_blob<256U>).m_data._M_elems[0x11] ==
                 result.super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar4[2] = -((hash->super_base_blob<256U>).m_data._M_elems[0x12] ==
                 result.super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar4[3] = -((hash->super_base_blob<256U>).m_data._M_elems[0x13] ==
                 result.super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar4[4] = -((hash->super_base_blob<256U>).m_data._M_elems[0x14] ==
                 result.super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar4[5] = -((hash->super_base_blob<256U>).m_data._M_elems[0x15] ==
                 result.super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar4[6] = -((hash->super_base_blob<256U>).m_data._M_elems[0x16] ==
                 result.super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar4[7] = -((hash->super_base_blob<256U>).m_data._M_elems[0x17] ==
                 result.super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar4[8] = -((hash->super_base_blob<256U>).m_data._M_elems[0x18] ==
                 result.super_base_blob<256U>.m_data._M_elems[0x18]);
    auVar4[9] = -((hash->super_base_blob<256U>).m_data._M_elems[0x19] ==
                 result.super_base_blob<256U>.m_data._M_elems[0x19]);
    auVar4[10] = -((hash->super_base_blob<256U>).m_data._M_elems[0x1a] ==
                  result.super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar4[0xb] = -((hash->super_base_blob<256U>).m_data._M_elems[0x1b] ==
                   result.super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar4[0xc] = -((hash->super_base_blob<256U>).m_data._M_elems[0x1c] ==
                   result.super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar4[0xd] = -((hash->super_base_blob<256U>).m_data._M_elems[0x1d] ==
                   result.super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar4[0xe] = -((hash->super_base_blob<256U>).m_data._M_elems[0x1e] ==
                   result.super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar4[0xf] = -((hash->super_base_blob<256U>).m_data._M_elems[0x1f] ==
                   result.super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar3[0] = -((hash->super_base_blob<256U>).m_data._M_elems[0] ==
                 result.super_base_blob<256U>.m_data._M_elems[0]);
    auVar3[1] = -((hash->super_base_blob<256U>).m_data._M_elems[1] ==
                 result.super_base_blob<256U>.m_data._M_elems[1]);
    auVar3[2] = -((hash->super_base_blob<256U>).m_data._M_elems[2] ==
                 result.super_base_blob<256U>.m_data._M_elems[2]);
    auVar3[3] = -((hash->super_base_blob<256U>).m_data._M_elems[3] ==
                 result.super_base_blob<256U>.m_data._M_elems[3]);
    auVar3[4] = -((hash->super_base_blob<256U>).m_data._M_elems[4] ==
                 result.super_base_blob<256U>.m_data._M_elems[4]);
    auVar3[5] = -((hash->super_base_blob<256U>).m_data._M_elems[5] ==
                 result.super_base_blob<256U>.m_data._M_elems[5]);
    auVar3[6] = -((hash->super_base_blob<256U>).m_data._M_elems[6] ==
                 result.super_base_blob<256U>.m_data._M_elems[6]);
    auVar3[7] = -((hash->super_base_blob<256U>).m_data._M_elems[7] ==
                 result.super_base_blob<256U>.m_data._M_elems[7]);
    auVar3[8] = -((hash->super_base_blob<256U>).m_data._M_elems[8] ==
                 result.super_base_blob<256U>.m_data._M_elems[8]);
    auVar3[9] = -((hash->super_base_blob<256U>).m_data._M_elems[9] ==
                 result.super_base_blob<256U>.m_data._M_elems[9]);
    auVar3[10] = -((hash->super_base_blob<256U>).m_data._M_elems[10] ==
                  result.super_base_blob<256U>.m_data._M_elems[10]);
    auVar3[0xb] = -((hash->super_base_blob<256U>).m_data._M_elems[0xb] ==
                   result.super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar3[0xc] = -((hash->super_base_blob<256U>).m_data._M_elems[0xc] ==
                   result.super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar3[0xd] = -((hash->super_base_blob<256U>).m_data._M_elems[0xd] ==
                   result.super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar3[0xe] = -((hash->super_base_blob<256U>).m_data._M_elems[0xe] ==
                   result.super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar3[0xf] = -((hash->super_base_blob<256U>).m_data._M_elems[0xf] ==
                   result.super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar3 = auVar3 & auVar4;
    if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) == 0xffff) {
      puVar5 = encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auVar3 = (undefined1  [16])
               encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._0_16_;
      encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      filter_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar6;
      encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = auVar1._0_8_;
      encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = auVar1._8_8_;
      filter_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      filter_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._0_16_ = auVar3;
      BlockFilter::BlockFilter
                ((BlockFilter *)local_88,this->m_filter_type,&block_hash,filter_00,
                 SUB81(&stack0xfffffffffffffea8,0));
      auVar3 = local_58;
      auVar1 = local_88;
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[0x1f] = local_68[0];
      *(undefined8 *)((filter->m_block_hash).super_base_blob<256U>.m_data._M_elems + 0xf) =
           local_78._0_8_;
      *(undefined8 *)((filter->m_block_hash).super_base_blob<256U>.m_data._M_elems + 0x17) =
           local_78._8_8_;
      filter->m_filter_type = local_88[0];
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[0] = local_88[1];
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[1] = local_88[2];
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[2] = local_88[3];
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[3] = local_88[4];
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[4] = local_88[5];
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[5] = local_88[6];
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[6] = local_88[7];
      *(undefined8 *)((filter->m_block_hash).super_base_blob<256U>.m_data._M_elems + 7) =
           local_88._8_8_;
      (filter->m_filter).m_params.m_siphash_k0 = local_68._8_8_;
      (filter->m_filter).m_params.m_siphash_k1 = local_58._0_8_;
      (filter->m_filter).m_params.m_P = local_58[8];
      *(undefined3 *)&(filter->m_filter).m_params.field_0x11 = local_58._9_3_;
      (filter->m_filter).m_params.m_M = local_58._12_4_;
      *(undefined8 *)&(filter->m_filter).m_N = local_48._0_8_;
      (filter->m_filter).m_F = local_48._8_8_;
      local_88 = auVar1;
      local_58 = auVar3;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (&(filter->m_filter).m_encoded,local_38);
      if ((pointer)local_38._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_38._0_8_,(long)local_28 - local_38._0_8_);
      }
      if (puVar5 != (pointer)0x0) {
        operator_delete(puVar5,(long)puVar6 - (long)puVar5);
      }
      bVar2 = true;
    }
    else {
      logging_function._M_str = "ReadFilterFromDisk";
      logging_function._M_len = 0x12;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/blockfilterindex.cpp"
      ;
      source_file._M_len = 0x6a;
      LogPrintFormatInternal<>
                (logging_function,source_file,0xb0,ALL,Error,(ConstevalFormatString<0U>)0x82cb86);
      bVar2 = false;
    }
    if (encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(encoded_filter.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)encoded_filter.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)encoded_filter.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  AutoFile::~AutoFile(&filein);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool BlockFilterIndex::ReadFilterFromDisk(const FlatFilePos& pos, const uint256& hash, BlockFilter& filter) const
{
    AutoFile filein{m_filter_fileseq->Open(pos, true)};
    if (filein.IsNull()) {
        return false;
    }

    // Check that the hash of the encoded_filter matches the one stored in the db.
    uint256 block_hash;
    std::vector<uint8_t> encoded_filter;
    try {
        filein >> block_hash >> encoded_filter;
        if (Hash(encoded_filter) != hash) {
            LogError("Checksum mismatch in filter decode.\n");
            return false;
        }
        filter = BlockFilter(GetFilterType(), block_hash, std::move(encoded_filter), /*skip_decode_check=*/true);
    }
    catch (const std::exception& e) {
        LogError("%s: Failed to deserialize block filter from disk: %s\n", __func__, e.what());
        return false;
    }

    return true;
}